

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 108_sortedArrayToBinarySearchTree.cpp
# Opt level: O0

TreeNode * sortedAtoBST(vector<int,_std::allocator<int>_> *nums,int start,int end)

{
  int end_00;
  reference pvVar1;
  TreeNode *pTVar2;
  TreeNode *root;
  int middle;
  int end_local;
  int start_local;
  vector<int,_std::allocator<int>_> *nums_local;
  
  if (start < end) {
    end_00 = (start + end) / 2;
    nums_local = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](nums,(long)end_00);
    TreeNode::TreeNode((TreeNode *)nums_local,*pvVar1);
    pTVar2 = sortedAtoBST(nums,start,end_00);
    ((TreeNode *)nums_local)->left = pTVar2;
    pTVar2 = sortedAtoBST(nums,end_00 + 1,end);
    ((TreeNode *)nums_local)->right = pTVar2;
  }
  else {
    nums_local = (vector<int,_std::allocator<int>_> *)0x0;
  }
  return (TreeNode *)nums_local;
}

Assistant:

TreeNode* sortedAtoBST(vector<int>& nums,int start,int end)
{
    if (end<=start)
        return NULL;
    int middle = (start+end)/2;
    TreeNode* root = new TreeNode(nums[middle]);
    root->left = sortedAtoBST(nums,start,middle);
    root->right = sortedAtoBST(nums,middle+1,end);
    return root;
}